

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

Matrix_t MatrixMultiply(int num,...)

{
  byte bVar1;
  undefined8 uVar2;
  Matrix_t MVar3;
  Matrix_t *pMVar4;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_1e8;
  undefined8 local_1c8 [4];
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined4 local_198;
  undefined4 local_188;
  undefined4 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  uint local_118;
  undefined4 local_114;
  va_list argp;
  float *local_f8;
  Matrix_t mat_err;
  Matrix_t mat_temp;
  Matrix_t mat_res;
  Matrix_t mat_group [10];
  uint8_t k;
  uint8_t r;
  int iStack_20;
  uint8_t c;
  float sum;
  int i;
  int num_local;
  float *local_10;
  
  if (in_AL != '\0') {
    local_198 = in_XMM0_Da;
    local_188 = in_XMM1_Da;
    local_178 = in_XMM2_Da;
    local_168 = in_XMM3_Qa;
    local_158 = in_XMM4_Qa;
    local_148 = in_XMM5_Qa;
    local_138 = in_XMM6_Qa;
    local_128 = in_XMM7_Qa;
  }
  mat_group[9]._12_4_ = 0;
  local_1c8[1] = in_RSI;
  local_1c8[2] = in_RDX;
  local_1c8[3] = in_RCX;
  local_1a8 = in_R8;
  local_1a0 = in_R9;
  memset(&local_f8,0,0x10);
  argp[0].overflow_arg_area = local_1c8;
  argp[0]._0_8_ = &stack0x00000008;
  local_114 = 0x30;
  local_118 = 8;
  for (iStack_20 = 0; iStack_20 < num; iStack_20 = iStack_20 + 1) {
    pMVar4 = mat_group + (long)iStack_20 + -1;
    if (local_118 < 0x21) {
      local_1e8 = (undefined8 *)((long)argp[0].overflow_arg_area + (long)(int)local_118);
      local_118 = local_118 + 0x10;
    }
    else {
      local_1e8 = (undefined8 *)argp[0]._0_8_;
      argp[0]._0_8_ = argp[0]._0_8_ + 0x10;
    }
    uVar2 = *local_1e8;
    pMVar4->row = (char)uVar2;
    pMVar4->column = (char)((ulong)uVar2 >> 8);
    *(int6 *)&pMVar4->field_0xa = (int6)((ulong)uVar2 >> 0x10);
    mat_group[iStack_20].pMatrix = (float *)local_1e8[1];
  }
  if (num < 2) {
    printf("ERROR: Martixs not enough!\n");
    _i = local_f8;
    local_10 = mat_err.pMatrix;
  }
  else {
    mat_temp._8_8_ = mat_res._8_8_;
    mat_res.pMatrix = mat_group[0].pMatrix;
    for (iStack_20 = 1; iStack_20 < num; iStack_20 = iStack_20 + 1) {
      if (*(char *)((long)&mat_group[iStack_20 + -1].pMatrix + 1) !=
          *(char *)&mat_group[iStack_20].pMatrix) {
        printf("ERROR: Martixs sizes don\'t match!\n");
      }
      bVar1 = *(byte *)((long)&mat_group[iStack_20].pMatrix + 1);
      mat_err._8_8_ = malloc(((ulong)mat_res.pMatrix & 0xff) * 4 * (ulong)bVar1);
      if ((void *)mat_err._8_8_ == (void *)0x0) {
        printf("ERROR: Malloc failed!-00");
      }
      for (mat_group[9]._10_1_ = 0; (byte)mat_group[9]._10_1_ < (byte)mat_res.pMatrix;
          mat_group[9]._10_1_ = mat_group[9]._10_1_ + '\x01') {
        for (mat_group[9]._11_1_ = 0;
            (byte)mat_group[9]._11_1_ < *(byte *)((long)&mat_group[iStack_20].pMatrix + 1);
            mat_group[9]._11_1_ = mat_group[9]._11_1_ + '\x01') {
          for (mat_group[9].column = '\0'; mat_group[9].column < mat_res.pMatrix._1_1_;
              mat_group[9].column = mat_group[9].column + '\x01') {
            mat_group[9]._12_4_ =
                 *(float *)(mat_temp._8_8_ +
                            (long)(int)((uint)mat_res.pMatrix._1_1_ *
                                       (uint)(byte)mat_group[9]._10_1_) * 4 +
                           (long)(int)(uint)mat_group[9].column * 4) *
                 *(float *)(*(long *)&mat_group[(long)iStack_20 + -1].row +
                            (long)(int)((uint)mat_group[9].column *
                                       (uint)*(byte *)((long)&mat_group[iStack_20].pMatrix + 1)) * 4
                           + (long)(int)(uint)(byte)mat_group[9]._11_1_ * 4) +
                 (float)mat_group[9]._12_4_;
          }
          *(undefined4 *)
           (mat_err._8_8_ + (long)(int)((uint)(byte)mat_group[9]._10_1_ * (uint)bVar1) * 4 +
           (long)(int)(uint)(byte)mat_group[9]._11_1_ * 4) = mat_group[9]._12_4_;
          mat_group[9]._12_4_ = 0;
        }
      }
      if (iStack_20 != 1) {
        free((void *)mat_temp._8_8_);
      }
      mat_temp.row = mat_err.row;
      mat_temp.column = mat_err.column;
      mat_temp._10_6_ = mat_err._10_6_;
      mat_res.pMatrix =
           (float *)CONCAT62(mat_temp.pMatrix._2_6_,CONCAT11(bVar1,(byte)mat_res.pMatrix));
    }
    _i = (float *)mat_temp._8_8_;
    local_10 = mat_res.pMatrix;
  }
  MVar3._8_8_ = local_10;
  MVar3.pMatrix = _i;
  return MVar3;
}

Assistant:

Matrix_t MatrixMultiply(int num, ...)
{
	int i;
	float sum = 0;
	uint8_t c, r, k;
	Matrix_t mat_group[MATRIX_MAX_MULTIPLY];
	Matrix_t mat_res;
	Matrix_t mat_temp;
	Matrix_t mat_err = {NULL, 0, 0};

	va_list argp;
	va_start(argp, num);
	for (i = 0; i < num; i++)
	{
		mat_group[i] = va_arg(argp, Matrix_t);
	}
	va_end(argp);

	if (num < 2)
	{
		printf("ERROR: Martixs not enough!\n");
		return mat_err;
	}
	else
	{
		mat_res = mat_group[0];
		for (i = 1; i < num; i++)
		{
			if (mat_group[i - 1].column != mat_group[i].row)
			{
				printf("ERROR: Martixs sizes don't match!\n");
			}
			mat_temp.row = mat_res.row;
			mat_temp.column = mat_group[i].column;
			mat_temp.pMatrix = (float *)malloc(sizeof(float) * mat_temp.row * mat_temp.column); //注意有无内存泄漏
			if (mat_temp.pMatrix == NULL)
				printf("ERROR: Malloc failed!-00");
			for (r = 0; r < mat_res.row; r++)
			{
				for (c = 0; c < mat_group[i].column; c++)
				{
					for (k = 0; k < mat_res.column; k++)
					{
						sum = sum + *(mat_res.pMatrix + mat_res.column * r + k) * *(mat_group[i].pMatrix + k * mat_group[i].column + c);
					}
					*(mat_temp.pMatrix + r * mat_temp.column + c) = sum;
					sum = 0;
				}
			}
			if (i != 1)
				free(mat_res.pMatrix);
			mat_res = mat_temp;
		}
		//Martix_display(mat_temp);
	}
	return mat_res;
}